

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O0

bool striequals(char *a,char *b)

{
  int iVar1;
  int iVar2;
  char *in_RSI;
  char *in_RDI;
  bool bVar3;
  char *local_18;
  char *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    bVar3 = false;
    if (*local_10 != '\0') {
      bVar3 = *local_18 != '\0';
    }
    if (!bVar3) break;
    iVar1 = tolower((int)*local_10);
    iVar2 = tolower((int)*local_18);
    if (iVar1 != iVar2) {
      return false;
    }
    local_10 = local_10 + 1;
    local_18 = local_18 + 1;
  }
  return *local_10 == *local_18;
}

Assistant:

static bool striequals(const char * a, const char * b) {
    for (; *a && *b; a++, b++) {
        if (std::tolower(*a) != std::tolower(*b)) {
            return false;
        }
    }
    return *a == *b;
}